

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptorTables * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateFileTables(Tables *this)

{
  pointer *pppFVar1;
  iterator __position;
  FileDescriptorTables *this_00;
  FileDescriptorTables *result;
  FileDescriptorTables *local_18;
  
  this_00 = (FileDescriptorTables *)operator_new(0x198);
  FileDescriptorTables::FileDescriptorTables(this_00);
  __position._M_current =
       (this->file_tables_).
       super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_18 = this_00;
  if (__position._M_current ==
      (this->file_tables_).
      super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::FileDescriptorTables*,std::allocator<google::protobuf::FileDescriptorTables*>>
    ::_M_realloc_insert<google::protobuf::FileDescriptorTables*const&>
              ((vector<google::protobuf::FileDescriptorTables*,std::allocator<google::protobuf::FileDescriptorTables*>>
                *)&this->file_tables_,__position,&local_18);
  }
  else {
    *__position._M_current = this_00;
    pppFVar1 = &(this->file_tables_).
                super__Vector_base<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppFVar1 = *pppFVar1 + 1;
  }
  return local_18;
}

Assistant:

FileDescriptorTables* DescriptorPool::Tables::AllocateFileTables() {
  FileDescriptorTables* result = new FileDescriptorTables;
  file_tables_.push_back(result);
  return result;
}